

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void QMessageBox::about(QWidget *parent,QString *title,QString *text)

{
  long lVar1;
  QWidget *this;
  long in_FS_OFFSET;
  double dVar2;
  undefined8 local_58;
  QSize local_50 [3];
  QIcon icon;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QWidget *)operator_new(0x28);
  QMessageBox((QMessageBox *)this,Information,title,text,(StandardButtons)0x0,parent,
              (WindowFlags)0x103);
  QWidget::setAttribute(this,WA_DeleteOnClose,true);
  icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::windowIcon((QWidget *)&icon);
  local_58 = 0x4000000040;
  dVar2 = (double)QPaintDevice::devicePixelRatio();
  QIcon::pixmap(local_50,dVar2,(Mode)(QWidget *)&icon,(State)&local_58);
  setIconPixmap((QMessageBox *)this,(QPixmap *)local_50);
  QPixmap::~QPixmap((QPixmap *)local_50);
  (**(code **)(*(long *)this + 0x1a8))(this);
  QIcon::~QIcon(&icon);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::about(QWidget *parent, const QString &title, const QString &text)
{
#ifdef Q_OS_MAC
    static QPointer<QMessageBox> oldMsgBox;

    if (oldMsgBox && oldMsgBox->text() == text) {
        oldMsgBox->show();
        oldMsgBox->raise();
        oldMsgBox->activateWindow();
        return;
    }
#endif

    QMessageBox *msgBox = new QMessageBox(Information, title, text, NoButton, parent
#ifdef Q_OS_MAC
                                          , Qt::WindowTitleHint | Qt::WindowSystemMenuHint
#endif
    );
    msgBox->setAttribute(Qt::WA_DeleteOnClose);
    QIcon icon = msgBox->windowIcon();
    msgBox->setIconPixmap(icon.pixmap(QSize(64, 64), msgBox->devicePixelRatio()));

    // should perhaps be a style hint
#ifdef Q_OS_MAC
    oldMsgBox = msgBox;
    auto *d = msgBox->d_func();
    d->buttonBox->setCenterButtons(true);
#ifdef Q_OS_IOS
    msgBox->setModal(true);
#else
    msgBox->setModal(false);
#endif
    msgBox->show();
#else
    msgBox->exec();
#endif
}